

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  unsigned_long *puVar5;
  int *piVar6;
  float *pfVar7;
  size_t sVar8;
  Allocator *pAVar9;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  float *outptr_5;
  Mat *top_blob_10;
  size_t i_12;
  int j_4;
  float *ptr_5;
  int p_2;
  Mat *top_blob_9;
  int slice_5;
  size_t i_11;
  int q_6;
  int channels_2;
  int h_4;
  int w_5;
  float *outptr_4;
  int size_3;
  Mat *top_blob_8;
  size_t i_10;
  float *ptr_4;
  int p_1;
  Mat *top_blob_7;
  int slice_4;
  size_t i_9;
  int q_5;
  int channels_1;
  int h_3;
  int w_4;
  float *outptr_3;
  float *ptr_3;
  int size_2;
  int j_3;
  float *outptr0_1;
  float *r3_1;
  float *r2_1;
  float *r1_1;
  float *r0_1;
  int q_4;
  int size_1;
  Mat *top_blob_6;
  size_t i_8;
  int p;
  Mat bottom_blob_unpacked_1;
  size_t i_7;
  int out_elempack_3;
  size_t out_elemsize_3;
  Mat *top_blob_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int slice_3;
  size_t i_6;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  float *outptr_2;
  Mat *top_blob_4;
  size_t i_5;
  float *ptr_2;
  int j_2;
  Mat *top_blob_3;
  int slice_2;
  size_t i_4;
  int q_2;
  int h_1;
  int w_2;
  float *outptr_1;
  int size;
  int j_1;
  float *outptr0;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  int j;
  Mat *top_blob_2;
  size_t i_3;
  float *ptr_1;
  Mat bottom_blob_unpacked;
  size_t i_2;
  int out_elempack_1;
  size_t out_elemsize_1;
  Mat *top_blob_1;
  size_t out_elemsize_2;
  int out_elempack_2;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  float *outptr;
  float *ptr;
  Mat *top_blob;
  size_t out_elemsize;
  int out_elempack;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *slices_ptr;
  int elempack;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff868;
  Mat *in_stack_fffffffffffff870;
  Mat *pMVar10;
  size_t in_stack_fffffffffffff878;
  size_t in_stack_fffffffffffff880;
  ulong uVar11;
  undefined8 in_stack_fffffffffffff888;
  Mat *in_stack_fffffffffffff890;
  Mat *in_stack_fffffffffffff898;
  Allocator *in_stack_fffffffffffff8a0;
  Allocator *_allocator;
  Mat *in_stack_fffffffffffff8a8;
  Mat *in_stack_fffffffffffff8b0;
  int local_654;
  Mat local_648;
  float *local_600;
  reference local_5f8;
  ulong local_5f0;
  int local_5e4;
  Mat local_5e0;
  Mat *local_598;
  int local_58c;
  reference local_588;
  int local_57c;
  Allocator *local_578;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  Mat local_560;
  float *local_518;
  int local_50c;
  reference local_508;
  ulong local_500;
  Mat local_4f8;
  float *local_4b0;
  int local_4a4;
  reference local_4a0;
  int local_494;
  ulong local_490;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  float *local_478;
  Mat local_470;
  float *local_428;
  int local_420;
  int local_41c;
  Mat local_418;
  float *local_3d0;
  Mat local_3c8;
  float *local_380;
  Mat local_378;
  float *local_330;
  Mat local_328;
  float *local_2e0;
  Mat local_2d8;
  float *local_290;
  int local_288;
  int local_284;
  reference local_280;
  ulong local_278;
  int local_26c;
  ulong local_220;
  int local_214;
  size_t local_210;
  reference local_208;
  long local_200;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  float *local_1d8;
  reference local_1d0;
  ulong local_1c8;
  float *local_1c0;
  int local_1b4;
  reference local_1b0;
  int local_1a4;
  ulong local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  float *local_188;
  int local_180;
  int local_17c;
  float *local_178;
  float *local_170;
  float *local_168;
  float *local_160;
  float *local_158;
  int local_14c;
  Mat *local_148;
  ulong local_140;
  float *local_138;
  Mat local_120;
  ulong local_d8;
  int local_cc;
  size_t local_c8;
  reference local_c0;
  long local_b8;
  int local_b0;
  int local_ac;
  ulong local_a8;
  int local_9c;
  int local_98;
  int local_94;
  float *local_90;
  float *local_88;
  reference local_80;
  long local_78;
  int local_70;
  int local_6c;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  int *local_50;
  int local_44;
  size_t local_40;
  int local_34;
  const_reference local_30;
  long local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->dims;
  local_40 = local_30->elemsize;
  local_44 = local_30->elempack;
  local_50 = Mat::operator_cast_to_int_((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118) < 0) {
    local_654 = local_34 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
  }
  else {
    local_654 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
  }
  local_54 = local_654;
  if (local_34 == 1) {
    local_58 = local_30->w * local_44;
    local_5c = 0;
    for (local_68 = 0; uVar11 = local_68,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_68 = local_68 + 1) {
      local_6c = local_50[local_68];
      if (local_6c == -0xe9) {
        iVar2 = local_58 - local_5c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_6c = (int)((ulong)(long)iVar2 / (sVar3 - local_68));
      }
      local_70 = 1;
      if (((*(byte *)(local_28 + 0x27) & 1) != 0) && (local_70 = 1, local_6c % 4 == 0)) {
        local_70 = 4;
      }
      local_78 = (local_40 / (ulong)(long)local_44) * (long)local_70;
      local_80 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_68);
      Mat::create(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                  in_stack_fffffffffffff880,(int)(in_stack_fffffffffffff878 >> 0x20),
                  (Allocator *)in_stack_fffffffffffff870);
      bVar1 = Mat::empty(in_stack_fffffffffffff870);
      if (bVar1) {
        return -100;
      }
      local_88 = Mat::operator_cast_to_float_(local_30);
      local_88 = local_88 + local_5c;
      local_90 = Mat::operator_cast_to_float_(local_80);
      memcpy(local_90,local_88,(long)local_80->w * local_80->elemsize);
      local_5c = local_6c + local_5c;
    }
  }
  if ((local_34 == 2) && (local_54 == 0)) {
    local_94 = local_30->w;
    local_98 = local_30->h * local_44;
    local_9c = 0;
    for (local_a8 = 0; uVar11 = local_a8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_a8 = local_a8 + 1) {
      local_ac = local_50[local_a8];
      if (local_ac == -0xe9) {
        iVar2 = local_98 - local_9c;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_ac = (int)((ulong)(long)iVar2 / (sVar3 - local_a8));
      }
      local_b0 = 1;
      if (((*(byte *)(local_28 + 0x27) & 1) != 0) && (local_b0 = 1, local_ac % 4 == 0)) {
        local_b0 = 4;
      }
      local_b8 = (local_40 / (ulong)(long)local_44) * (long)local_b0;
      local_c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_a8);
      Mat::create(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                  (int)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                  (int)(in_stack_fffffffffffff878 >> 0x20),(Allocator *)in_stack_fffffffffffff870);
      bVar1 = Mat::empty(in_stack_fffffffffffff870);
      if (bVar1) {
        return -100;
      }
      local_9c = local_ac + local_9c;
    }
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_c8 = pvVar4->elemsize;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_cc = pvVar4->elempack;
    for (local_d8 = 0; uVar11 = local_d8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_d8 = local_d8 + 1) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d8);
      puVar5 = std::min<unsigned_long>(&local_c8,&pvVar4->elemsize);
      local_c8 = *puVar5;
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d8);
      piVar6 = std::min<int>(&local_cc,&pvVar4->elempack);
      local_cc = *piVar6;
    }
    Mat::Mat(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    if (local_cc < local_44) {
      convert_packing(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                      (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),
                      (Option *)in_stack_fffffffffffff898);
    }
    local_138 = Mat::operator_cast_to_float_(&local_120);
    for (local_140 = 0; uVar11 = local_140,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_140 = local_140 + 1) {
      local_148 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_140)
      ;
      if ((local_cc == 1) && (local_148->elempack == 4)) {
        for (local_14c = 0; local_14c < local_148->h; local_14c = local_14c + 1) {
          local_158 = local_138;
          local_160 = local_138 + local_94;
          local_168 = local_138 + local_94 * 2;
          local_170 = local_138 + local_94 * 3;
          local_178 = Mat::row(local_148,local_14c);
          for (local_17c = 0; local_17c < local_94; local_17c = local_17c + 1) {
            *local_178 = *local_158;
            local_178[1] = *local_160;
            local_178[2] = *local_168;
            local_178[3] = *local_170;
            local_178 = local_178 + 4;
            local_170 = local_170 + 1;
            local_168 = local_168 + 1;
            local_160 = local_160 + 1;
            local_158 = local_158 + 1;
          }
          local_138 = local_138 + (local_94 << 2);
        }
      }
      if (local_cc == local_148->elempack) {
        local_180 = local_94 * local_148->h;
        local_188 = Mat::operator_cast_to_float_(local_148);
        memcpy(local_188,local_138,(long)local_180 * local_148->elemsize);
        local_138 = local_138 + local_180 * local_148->elempack;
      }
    }
    Mat::~Mat((Mat *)0x4ff87f);
  }
  if ((local_34 == 2) && (local_54 == 1)) {
    local_18c = local_30->w;
    local_190 = local_30->h;
    local_194 = 0;
    for (local_1a0 = 0; uVar11 = local_1a0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_1a0 = local_1a0 + 1) {
      local_1a4 = local_50[local_1a0];
      if (local_1a4 == -0xe9) {
        iVar2 = local_18c - local_194;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_1a4 = (int)((ulong)(long)iVar2 / (sVar3 - local_1a0));
      }
      local_1b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_1a0)
      ;
      Mat::create(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                  (int)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                  (int)(in_stack_fffffffffffff878 >> 0x20),(Allocator *)in_stack_fffffffffffff870);
      bVar1 = Mat::empty(in_stack_fffffffffffff870);
      if (bVar1) {
        return -100;
      }
      local_194 = local_1a4 + local_194;
    }
    for (local_1b4 = 0; local_1b4 < local_190; local_1b4 = local_1b4 + 1) {
      local_1c0 = Mat::row<float_const>(local_30,local_1b4);
      for (local_1c8 = 0; uVar11 = local_1c8,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3
          ; local_1c8 = local_1c8 + 1) {
        local_1d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_20,local_1c8);
        local_1d8 = Mat::row(local_1d0,local_1b4);
        memcpy(local_1d8,local_1c0,(long)local_1d0->w * local_40);
        local_1c0 = local_1c0 + local_1d0->w * local_44;
      }
    }
  }
  if ((local_34 == 3) && (local_54 == 0)) {
    local_1dc = local_30->w;
    local_1e0 = local_30->h;
    local_1e4 = local_30->c * local_44;
    local_1e8 = 0;
    for (local_1f0 = 0; uVar11 = local_1f0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_1f0 = local_1f0 + 1) {
      local_1f4 = local_50[local_1f0];
      if (local_1f4 == -0xe9) {
        iVar2 = local_1e4 - local_1e8;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_1f4 = (int)((ulong)(long)iVar2 / (sVar3 - local_1f0));
      }
      local_1f8 = 1;
      if (((*(byte *)(local_28 + 0x27) & 1) != 0) && (local_1f8 = 1, local_1f4 % 4 == 0)) {
        local_1f8 = 4;
      }
      local_200 = (local_40 / (ulong)(long)local_44) * (long)local_1f8;
      local_208 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_1f0)
      ;
      in_stack_fffffffffffff868 = *(Mat **)(local_28 + 8);
      Mat::create(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                  (int)in_stack_fffffffffffff888,(int)(in_stack_fffffffffffff880 >> 0x20),
                  in_stack_fffffffffffff878,(int)((ulong)in_stack_fffffffffffff870 >> 0x20),
                  in_stack_fffffffffffff8a0);
      bVar1 = Mat::empty(in_stack_fffffffffffff870);
      if (bVar1) {
        return -100;
      }
      local_1e8 = local_1f4 + local_1e8;
    }
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_210 = pvVar4->elemsize;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    local_214 = pvVar4->elempack;
    for (local_220 = 0; uVar11 = local_220,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_220 = local_220 + 1) {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_220);
      puVar5 = std::min<unsigned_long>(&local_210,&pvVar4->elemsize);
      local_210 = *puVar5;
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_220);
      piVar6 = std::min<int>(&local_214,&pvVar4->elempack);
      local_214 = *piVar6;
    }
    Mat::Mat(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    if (local_214 < local_44) {
      convert_packing(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                      (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),
                      (Option *)in_stack_fffffffffffff898);
    }
    local_26c = 0;
    for (local_278 = 0; uVar11 = local_278,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_278 = local_278 + 1) {
      local_280 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_278)
      ;
      if ((local_214 == 1) && (local_280->elempack == 4)) {
        local_284 = local_280->w * local_280->h;
        for (local_288 = 0; local_288 < local_280->c; local_288 = local_288 + 1) {
          Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
          pfVar7 = Mat::operator_cast_to_float_(&local_2d8);
          Mat::~Mat((Mat *)0x4fffed);
          local_290 = pfVar7;
          Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
          pfVar7 = Mat::operator_cast_to_float_(&local_328);
          Mat::~Mat((Mat *)0x500041);
          local_2e0 = pfVar7;
          Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
          pfVar7 = Mat::operator_cast_to_float_(&local_378);
          Mat::~Mat((Mat *)0x500096);
          local_330 = pfVar7;
          Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
          pfVar7 = Mat::operator_cast_to_float_(&local_3c8);
          Mat::~Mat((Mat *)0x5000eb);
          local_380 = pfVar7;
          Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
          pfVar7 = Mat::operator_cast_to_float_(&local_418);
          Mat::~Mat((Mat *)0x50013d);
          local_3d0 = pfVar7;
          for (local_41c = 0; local_41c < local_284; local_41c = local_41c + 1) {
            *local_3d0 = *local_290;
            local_3d0[1] = *local_2e0;
            local_3d0[2] = *local_330;
            local_3d0[3] = *local_380;
            local_3d0 = local_3d0 + 4;
            local_380 = local_380 + 1;
            local_330 = local_330 + 1;
            local_2e0 = local_2e0 + 1;
            local_290 = local_290 + 1;
          }
          local_26c = local_26c + 4;
        }
      }
      if (local_214 == local_280->elempack) {
        sVar8 = Mat::total(local_280);
        local_420 = (int)sVar8;
        Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
        pfVar7 = Mat::operator_cast_to_float_(&local_470);
        Mat::~Mat((Mat *)0x50039c);
        local_428 = pfVar7;
        local_478 = Mat::operator_cast_to_float_(local_280);
        memcpy(local_478,local_428,(long)local_420 * local_280->elemsize);
        local_26c = local_280->c + local_26c;
      }
    }
    Mat::~Mat((Mat *)0x50045d);
  }
  if ((local_34 == 3) && (local_54 == 1)) {
    local_47c = local_30->w;
    local_480 = local_30->h;
    local_484 = local_30->c;
    local_488 = 0;
    for (local_490 = 0; uVar11 = local_490,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3;
        local_490 = local_490 + 1) {
      local_494 = local_50[local_490];
      if (local_494 == -0xe9) {
        iVar2 = local_480 - local_488;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_494 = (int)((ulong)(long)iVar2 / (sVar3 - local_490));
      }
      local_4a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_490)
      ;
      Mat::create(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                  (int)in_stack_fffffffffffff888,(int)(in_stack_fffffffffffff880 >> 0x20),
                  in_stack_fffffffffffff878,(int)((ulong)in_stack_fffffffffffff870 >> 0x20),
                  in_stack_fffffffffffff8a0);
      bVar1 = Mat::empty(in_stack_fffffffffffff870);
      if (bVar1) {
        return -100;
      }
      local_488 = local_494 + local_488;
    }
    for (local_4a4 = 0; local_4a4 < local_484; local_4a4 = local_4a4 + 1) {
      Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
      pfVar7 = Mat::operator_cast_to_float_(&local_4f8);
      Mat::~Mat((Mat *)0x500678);
      local_4b0 = pfVar7;
      for (local_500 = 0; uVar11 = local_500,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar11 < sVar3
          ; local_500 = local_500 + 1) {
        local_508 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_20,local_500);
        local_50c = local_508->w * local_508->h;
        pMVar10 = &local_560;
        Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
        pfVar7 = Mat::operator_cast_to_float_(pMVar10);
        Mat::~Mat((Mat *)0x500730);
        local_518 = pfVar7;
        memcpy(pfVar7,local_4b0,(long)local_50c * local_40);
        local_4b0 = local_4b0 + local_50c * local_44;
      }
    }
  }
  if ((local_34 == 3) && (local_54 == 2)) {
    local_564 = local_30->w;
    local_568 = local_30->h;
    local_56c = local_30->c;
    local_570 = 0;
    local_578 = (Allocator *)0x0;
    while (_allocator = local_578,
          pAVar9 = (Allocator *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20),
          _allocator < pAVar9) {
      local_57c = local_50[(long)local_578];
      if (local_57c == -0xe9) {
        in_stack_fffffffffffff898 = (Mat *)(long)(local_564 - local_570);
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_57c = (int)((ulong)in_stack_fffffffffffff898 / (sVar3 - (long)local_578));
      }
      local_588 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_20,(size_type)local_578);
      Mat::create(in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                  (int)in_stack_fffffffffffff888,(int)(in_stack_fffffffffffff880 >> 0x20),
                  in_stack_fffffffffffff878,(int)((ulong)in_stack_fffffffffffff870 >> 0x20),
                  _allocator);
      bVar1 = Mat::empty(in_stack_fffffffffffff870);
      if (bVar1) {
        return -100;
      }
      local_570 = local_57c + local_570;
      local_578 = (Allocator *)((long)&local_578->_vptr_Allocator + 1);
    }
    for (local_58c = 0; local_58c < local_56c; local_58c = local_58c + 1) {
      pMVar10 = &local_5e0;
      Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
      in_stack_fffffffffffff890 = (Mat *)Mat::operator_cast_to_float_(pMVar10);
      Mat::~Mat((Mat *)0x500a12);
      local_598 = in_stack_fffffffffffff890;
      for (local_5e4 = 0; local_5e4 < local_568; local_5e4 = local_5e4 + 1) {
        local_5f0 = 0;
        while (uVar11 = local_5f0,
              sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20),
              uVar11 < sVar3) {
          local_5f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_20,local_5f0);
          pMVar10 = &local_648;
          Mat::channel(in_stack_fffffffffffff898,(int)((ulong)in_stack_fffffffffffff890 >> 0x20));
          pfVar7 = Mat::row(pMVar10,local_5e4);
          Mat::~Mat((Mat *)0x500ad8);
          local_600 = pfVar7;
          memcpy(pfVar7,local_598,(long)local_5f8->w * local_40);
          local_598 = (Mat *)((long)&local_598->data + (long)(local_5f8->w * local_44) * 4);
          local_5f0 = local_5f0 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}